

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.h
# Opt level: O0

bool comparesEqual(QRectF *r1,QRect *r2)

{
  long lVar1;
  bool bVar2;
  QRectF *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRect *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QRectF::topLeft(in_RSI);
  QRect::topLeft(in_stack_ffffffffffffffa8);
  bVar2 = operator==((QPointF *)
                     CONCAT17(in_stack_ffffffffffffffb7,
                              CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                     (QPoint *)in_stack_ffffffffffffffa8);
  uVar3 = false;
  if (bVar2) {
    QRectF::size(in_RSI);
    QRect::size(in_RDI);
    uVar3 = operator==((QSizeF *)
                       CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0))
                       ,(QSize *)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)uVar3;
}

Assistant:

constexpr bool comparesEqual(const QRectF &r1, const QRect &r2) noexcept
    { return r1.topLeft() == r2.topLeft() && r1.size() == r2.size(); }